

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialProps.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  int iVar4;
  char *pcVar5;
  SimInfo *info_00;
  FluxOut *this;
  RealType dropletR;
  SimInfo *info;
  RealType centroidY;
  string sele1;
  RealType solidZ;
  long local_2d0 [2];
  string sele2;
  string dumpFileName;
  RealType bufferLength;
  RealType threshDens;
  FluxOut *local_270;
  SimCreator creator;
  gengetopt_args_info args_info;
  
  iVar4 = cmdline_parser(argc,argv,&args_info);
  if (iVar4 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dumpFileName,args_info.input_arg,(allocator<char> *)&creator);
    sele1._M_dataplus._M_p = (pointer)&sele1.field_2;
    sele1._M_string_length = 0;
    sele1.field_2._M_local_buf[0] = '\0';
    paVar1 = &sele2.field_2;
    sele2._M_string_length = 0;
    sele2.field_2._M_local_buf[0] = '\0';
    sele2._M_dataplus._M_p = (pointer)paVar1;
    if (args_info.sele1_given == 0) {
      pcVar5 = getenv("SELECTION1");
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "select all";
      }
      else {
        strlen(pcVar5);
      }
      std::__cxx11::string::_M_replace((ulong)&sele1,0,(char *)0x0,(ulong)pcVar5);
    }
    else {
      strlen(args_info.sele1_arg);
      std::__cxx11::string::_M_replace((ulong)&sele1,0,(char *)0x0,(ulong)args_info.sele1_arg);
    }
    sVar3 = sele2._M_string_length;
    if (args_info.sele2_given == 0) {
      pcVar5 = getenv("SELECTION2");
      sVar3 = sele2._M_string_length;
      if (pcVar5 == (char *)0x0) {
        std::__cxx11::string::_M_assign((string *)&sele2);
      }
      else {
        strlen(pcVar5);
        std::__cxx11::string::_M_replace((ulong)&sele2,0,(char *)sVar3,(ulong)pcVar5);
      }
    }
    else {
      strlen(args_info.sele2_arg);
      std::__cxx11::string::_M_replace((ulong)&sele2,0,(char *)sVar3,(ulong)args_info.sele2_arg);
    }
    paVar2 = &creator.mdFileName_.field_2;
    creator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_00250f58;
    creator.mdFileName_._M_string_length = 0;
    creator.mdFileName_.field_2._M_local_buf[0] = '\0';
    creator.mdFileName_._M_dataplus._M_p = (pointer)paVar2;
    info_00 = OpenMD::SimCreator::createSim(&creator,&dumpFileName,false);
    iVar4 = (args_info.privilegedAxis_arg != privilegedAxis_arg_y) + 1;
    if (args_info.privilegedAxis_arg == privilegedAxis_arg_x) {
      iVar4 = 0;
    }
    info = info_00;
    if (args_info.com_given == 0) {
      if (args_info.comvel_given == 0) {
        if (args_info.fluxOut_given == 0) {
          if (args_info.deltaCount_given == 0) {
            if (args_info.testequi_given == 0) {
              if (args_info.gcn_given == 0) {
                if (args_info.ca1_given == 0) {
                  if (args_info.ca2_given == 0) {
                    this = (FluxOut *)0x0;
                  }
                  else {
                    solidZ = 0.0;
                    if (args_info.referenceZ_given == 0) {
                      builtin_strncpy(painCave.errMsg + 0x10,"t be set if --ca2 is used\n",0x1b);
                      builtin_strncpy(painCave.errMsg,"--referenceZ mus",0x10);
                      painCave.isFatal = 1;
                      painCave.severity = 1;
                      simError();
                    }
                    else {
                      solidZ = args_info.referenceZ_arg;
                    }
                    dropletR = 0.0;
                    if (args_info.centroidX_given == 0) {
                      builtin_strncpy(painCave.errMsg + 0x10," be set if --ca2 is used\n",0x1a);
                      builtin_strncpy(painCave.errMsg,"--centroidX must",0x10);
                      painCave.isFatal = 1;
                      painCave.severity = 1;
                      simError();
                    }
                    else {
                      dropletR = args_info.centroidX_arg;
                    }
                    centroidY = 0.0;
                    if (args_info.centroidY_given == 0) {
                      builtin_strncpy(painCave.errMsg + 0x10," be set if --ca2 is used\n",0x1a);
                      builtin_strncpy(painCave.errMsg,"--centroidY must",0x10);
                      painCave.isFatal = 1;
                      painCave.severity = 1;
                      simError();
                    }
                    else {
                      centroidY = args_info.centroidY_arg;
                    }
                    threshDens = 0.0;
                    if (args_info.threshDens_given == 0) {
                      builtin_strncpy(painCave.errMsg + 0x10,"t be set if --ca2 is used\n",0x1b);
                      builtin_strncpy(painCave.errMsg,"--threshDens mus",0x10);
                      painCave.isFatal = 1;
                      painCave.severity = 1;
                      simError();
                    }
                    else {
                      threshDens = args_info.threshDens_arg;
                    }
                    bufferLength = 0.0;
                    if (args_info.bufferLength_given == 0) {
                      builtin_strncpy(painCave.errMsg + 0x10,"ust be set if --ca2 is used\n",0x1d);
                      builtin_strncpy(painCave.errMsg,"--bufferLength m",0x10);
                      painCave.isFatal = 1;
                      painCave.severity = 1;
                      simError();
                    }
                    else {
                      bufferLength = args_info.bufferLength_arg;
                    }
                    std::
                    make_unique<OpenMD::ContactAngle2,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&,double&,double&,int&,int&>
                              ((SimInfo **)&local_270,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &info,&dumpFileName,&sele1,(double *)&sele2,&solidZ,&dropletR,
                               &centroidY,&threshDens,(int *)&bufferLength,&args_info.nbins_arg);
                    this = local_270;
                  }
                }
                else {
                  solidZ = 0.0;
                  if (args_info.referenceZ_given == 0) {
                    builtin_strncpy(painCave.errMsg + 0x10,"t be set if --ca1 is used\n",0x1b);
                    builtin_strncpy(painCave.errMsg,"--referenceZ mus",0x10);
                    painCave.isFatal = 1;
                    painCave.severity = 1;
                    simError();
                  }
                  else {
                    solidZ = args_info.referenceZ_arg;
                  }
                  dropletR = 0.0;
                  if (args_info.dropletR_given == 0) {
                    builtin_strncpy(painCave.errMsg + 0x10,"be set if --ca1 is used\n",0x19);
                    builtin_strncpy(painCave.errMsg,"--dropletR must ",0x10);
                    painCave.isFatal = 1;
                    painCave.severity = 1;
                    simError();
                  }
                  else {
                    dropletR = args_info.dropletR_arg;
                  }
                  std::
                  make_unique<OpenMD::ContactAngle1,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&>
                            ((SimInfo **)&centroidY,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &info,&dumpFileName,&sele1,(double *)&sele2,&solidZ);
                  this = (FluxOut *)centroidY;
                }
              }
              else if (args_info.rcut_given == 0) {
                memcpy(&painCave,
                       "A cutoff radius (rcut) must be specified when calculating\n\tGeneralized Coordinate Number"
                       ,0x59);
                painCave.isFatal = 1;
                painCave.severity = 1;
                simError();
                this = (FluxOut *)0x0;
              }
              else {
                std::
                make_unique<OpenMD::GCNSeq,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,int&>
                          ((SimInfo **)&solidZ,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &info,&dumpFileName,&sele1,(double *)&sele2,(int *)&args_info.rcut_arg);
                this = (FluxOut *)solidZ;
              }
            }
            else {
              std::
              make_unique<OpenMD::Equipartition,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                        ((SimInfo **)&solidZ,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                         &dumpFileName,&sele1);
              this = (FluxOut *)solidZ;
            }
          }
          else {
            this = (FluxOut *)operator_new(0xd60);
            OpenMD::CountDifference::CountDifference
                      ((CountDifference *)this,info_00,&dumpFileName,&sele1,&sele2);
          }
        }
        else {
          this = (FluxOut *)operator_new(0xd80);
          OpenMD::FluxOut::FluxOut(this,info_00,&dumpFileName,&sele1,iVar4);
        }
      }
      else {
        this = (FluxOut *)operator_new(0xd60);
        OpenMD::COMVel::COMVel((COMVel *)this,info_00,&dumpFileName,&sele1,&sele2);
      }
    }
    else {
      this = (FluxOut *)operator_new(0xd60);
      OpenMD::CenterOfMass::CenterOfMass((CenterOfMass *)this,info_00,&dumpFileName,&sele1,&sele2);
    }
    if (this == (FluxOut *)0x0) {
      builtin_strncpy(painCave.errMsg + 0x31," to do!",8);
      builtin_strncpy(painCave.errMsg + 0x10," No Analyzer was created, nothing",0x21);
      builtin_strncpy(painCave.errMsg,"SequentialProps:",0x10);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      if (args_info.output_given != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&solidZ,args_info.output_arg,(allocator<char> *)&dropletR);
        std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_)
        ;
        if ((long *)solidZ != local_2d0) {
          operator_delete((void *)solidZ,local_2d0[0] + 1);
        }
      }
      (*(this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer[2])(this);
    }
    if (info != (SimInfo *)0x0) {
      (*info->_vptr_SimInfo[1])();
    }
    if (this != (FluxOut *)0x0) {
      (*(this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer[1])(this);
    }
    creator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_00250f58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)creator.mdFileName_._M_dataplus._M_p != paVar2) {
      operator_delete(creator.mdFileName_._M_dataplus._M_p,
                      CONCAT71(creator.mdFileName_.field_2._M_allocated_capacity._1_7_,
                               creator.mdFileName_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sele2._M_dataplus._M_p != paVar1) {
      operator_delete(sele2._M_dataplus._M_p,
                      CONCAT71(sele2.field_2._M_allocated_capacity._1_7_,
                               sele2.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sele1._M_dataplus._M_p != &sele1.field_2) {
      operator_delete(sele1._M_dataplus._M_p,
                      CONCAT71(sele1.field_2._M_allocated_capacity._1_7_,
                               sele1.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dumpFileName._M_dataplus._M_p != &dumpFileName.field_2) {
      operator_delete(dumpFileName._M_dataplus._M_p,dumpFileName.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;

  // parse the command line option
  if (cmdline_parser(argc, argv, &args_info) != 0) { exit(1); }

  // get the dumpfile name and meta-data file name
  std::string dumpFileName = args_info.input_arg;

  std::string sele1;
  std::string sele2;

  // check the first selection argument, or set it to the environment
  // variable, or failing that, set it to "select all"

  if (args_info.sele1_given) {
    sele1 = args_info.sele1_arg;
  } else {
    char* sele1Env = getenv("SELECTION1");
    if (sele1Env) {
      sele1 = sele1Env;
    } else {
      sele1 = "select all";
    }
  }

  // check the second selection argument, or set it to the environment
  // variable, or failing that, set it to the first selection

  if (args_info.sele2_given) {
    sele2 = args_info.sele2_arg;
  } else {
    char* sele2Env = getenv("SELECTION2");
    if (sele2Env) {
      sele2 = sele2Env;
    } else {
      // If sele2 is not specified, then the default behavior
      // should be what is already intended for sele1
      sele2 = sele1;
    }
  }

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info = creator.createSim(dumpFileName, false);

  // convert privilegedAxis to corresponding integer
  // x axis -> 0
  // y axis -> 1
  // z axis -> 2 (default)

  int privilegedAxis;
  switch (args_info.privilegedAxis_arg) {
  case privilegedAxis_arg_x:
    privilegedAxis = 0;
    break;
  case privilegedAxis_arg_y:
    privilegedAxis = 1;
    break;
  case privilegedAxis_arg_z:
  default:
    privilegedAxis = 2;
    break;
  }

  std::unique_ptr<SequentialAnalyzer> analyzer {nullptr};

  if (args_info.com_given) {
    analyzer = std::make_unique<CenterOfMass>(info, dumpFileName, sele1, sele2);
  } else if (args_info.comvel_given) {
    analyzer = std::make_unique<COMVel>(info, dumpFileName, sele1, sele2);
  } else if (args_info.fluxOut_given) {
    analyzer = std::make_unique<FluxOut>(info, dumpFileName, sele1,
					 privilegedAxis);
  } else if (args_info.deltaCount_given) {
    analyzer = std::make_unique<CountDifference>(info, dumpFileName, sele1,
						 sele2);
  } else if (args_info.testequi_given) {
    analyzer = std::make_unique<Equipartition>(info, dumpFileName, sele1,
					       sele2);
  } else if (args_info.gcn_given) {
    if (args_info.rcut_given) {
      analyzer = std::make_unique<GCNSeq>(info, dumpFileName, sele1, sele2,
					  args_info.rcut_arg,
					  args_info.nbins_arg);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "A cutoff radius (rcut) must be specified when calculating\n"
               "\tGeneralized Coordinate Number");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  } else if (args_info.ca1_given) {
    RealType solidZ(0.0);
    if (args_info.referenceZ_given)
      solidZ = args_info.referenceZ_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--referenceZ must be set if --ca1 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType dropletR(0.0);
    if (args_info.dropletR_given)
      dropletR = args_info.dropletR_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--dropletR must be set if --ca1 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    analyzer =
      std::make_unique<ContactAngle1>(info, dumpFileName, sele1, sele2,
				      solidZ, dropletR);
  } else if (args_info.ca2_given) {
    RealType solidZ(0.0);
    if (args_info.referenceZ_given)
      solidZ = args_info.referenceZ_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--referenceZ must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType centroidX(0.0);
    if (args_info.centroidX_given)
      centroidX = args_info.centroidX_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--centroidX must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType centroidY(0.0);
    if (args_info.centroidY_given)
      centroidY = args_info.centroidY_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--centroidY must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType threshDens(0.0);
    if (args_info.threshDens_given)
      threshDens = args_info.threshDens_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--threshDens must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType bufferLength(0.0);
    if (args_info.bufferLength_given)
      bufferLength = args_info.bufferLength_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--bufferLength must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    analyzer = std::make_unique<ContactAngle2>(info, dumpFileName, sele1,
					       sele2, solidZ, centroidX,
					       centroidY, threshDens,
					       bufferLength,
					       args_info.nbins_arg,
					       args_info.nbins_z_arg);
  }

  if (analyzer != NULL) {
    
    if (args_info.output_given) {
      analyzer->setOutputName(args_info.output_arg);
    }

    analyzer->doSequence();
  } else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "SequentialProps: No Analyzer was created, nothing to do!");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  delete info;

  return 0;
}